

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

bool nite::isLower(string *Input)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  uint local_1c;
  char c;
  uint i;
  string *Input_local;
  
  local_1c = 0;
  while( true ) {
    uVar2 = std::__cxx11::string::length();
    if (uVar2 <= local_1c) {
      return true;
    }
    pcVar3 = (char *)std::__cxx11::string::at((ulong)Input);
    iVar1 = islower((int)*pcVar3);
    if (iVar1 == 0) break;
    local_1c = local_1c + 1;
  }
  return false;
}

Assistant:

bool nite::isLower(const String &Input){
	for (unsigned i=0; i<Input.length(); i++){
		char c = Input.at(i);
		if (!islower(c))
			return 0;
	}
	return 1;
}